

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

RefEq * __thiscall MixedArena::alloc<wasm::RefEq>(MixedArena *this)

{
  RefEq *pRVar1;
  
  pRVar1 = (RefEq *)allocSpace(this,0x20,8);
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression._id = RefEqId;
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression.type.id = 0;
  return pRVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }